

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O1

void __thiscall KktCheck::chDualFeas(KktCheck *this)

{
  double *pdVar1;
  double dVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  pointer pdVar6;
  bool bVar7;
  ostream *poVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  
  this->i = 0;
  if (this->numCol < 1) {
    bVar7 = true;
  }
  else {
    iVar9 = 0;
    bVar7 = true;
    do {
      dVar13 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar9];
      if ((((dVar13 != -1e+200) || (NAN(dVar13))) ||
          (dVar14 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar9], dVar14 != 1e+200)) || (NAN(dVar14))) {
        dVar14 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar9];
        if ((dVar14 != dVar13) ||
           ((this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar9] <= dVar13)) {
          dVar2 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar9];
          if ((dVar14 == dVar2) &&
             ((dVar13 < dVar2 &&
              (dVar13 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar9],
              this->tol <= dVar13 && dVar13 != this->tol)))) {
            if (this->print == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail: x[",0x19);
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]=",2);
              poVar8 = std::ostream::_M_insert<double>
                                 ((this->colValue).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"=u[",3);
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 (poVar8,(this->cIndexRev).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[this->i]);
              lVar10 = 5;
              pcVar11 = "], z[";
              goto LAB_0014fd51;
            }
            goto LAB_0014fde3;
          }
        }
        else {
          dVar13 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar9];
          if ((dVar13 < 0.0) && (dVar13 = ABS(dVar13), this->tol <= dVar13 && dVar13 != this->tol))
          {
            if (this->print == 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Dual feasibility fail: l[",0x19);
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cout,
                                  (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]=",2);
              poVar8 = std::ostream::_M_insert<double>
                                 ((this->colLower).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8," = x[",5);
              poVar8 = (ostream *)
                       std::ostream::operator<<
                                 (poVar8,(this->cIndexRev).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[this->i]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]=",2);
              poVar8 = std::ostream::_M_insert<double>
                                 ((this->colValue).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[this->i]);
              lVar10 = 4;
              pcVar11 = ", z[";
LAB_0014fd51:
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar11,lVar10);
              iVar9 = (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[this->i];
              goto LAB_0014fd67;
            }
LAB_0014fde3:
            bVar7 = false;
          }
        }
      }
      else {
        dVar13 = ABS((this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar9]);
        if (this->tol <= dVar13 && dVar13 != this->tol) {
          if (this->print != 1) goto LAB_0014fde3;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Dual feasibility fail: l=-inf, x[",0x21);
          poVar8 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]=",2);
          poVar8 = std::ostream::_M_insert<double>
                             ((this->colValue).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,", u=inf, z[",0xb);
          iVar9 = this->i;
LAB_0014fd67:
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]=",2);
          poVar8 = std::ostream::_M_insert<double>
                             ((this->colDual).super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start[this->i]);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          bVar7 = false;
        }
      }
      iVar9 = this->i + 1;
      this->i = iVar9;
    } while (iVar9 < this->numCol);
  }
  this->i = 0;
  if (0 < this->numRow) {
    iVar9 = 0;
    do {
      lVar10 = (long)iVar9;
      piVar3 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar3[lVar10];
      lVar12 = (long)iVar9;
      this->k = iVar9;
      dVar13 = 0.0;
      if (iVar9 < piVar3[lVar10 + 1]) {
        piVar4 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar9 = iVar9 + 1;
          dVar13 = dVar13 + pdVar6[piVar4[lVar12]] * pdVar5[lVar12];
          lVar12 = lVar12 + 1;
          this->k = iVar9;
        } while (lVar12 < piVar3[lVar10 + 1]);
      }
      dVar14 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10];
      dVar2 = this->tol;
      if (dVar2 <= ABS(dVar14 - dVar13)) {
LAB_0014ff0d:
        if ((dVar13 <= dVar14) ||
           (dVar2 <= ABS(dVar13 - (this->rowUpper).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar10]))) {
          if ((dVar14 < dVar13 + dVar2) &&
             (dVar13 < (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10] + dVar2)) {
            dVar14 = ABS((this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[lVar10]);
            goto LAB_0014ff80;
          }
        }
        else {
          pdVar1 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar10;
          if (*pdVar1 <= -dVar2 && -dVar2 != *pdVar1) goto LAB_0014ff8a;
        }
      }
      else if (dVar2 <= ABS((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar10] - dVar13)) {
        if ((dVar2 <= ABS(dVar14 - dVar13)) ||
           ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] <= dVar13)) goto LAB_0014ff0d;
        dVar14 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
LAB_0014ff80:
        if (dVar2 < dVar14) {
LAB_0014ff8a:
          if (this->print == 1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Dual feasibility fail for row ",0x1e);
            poVar8 = (ostream *)
                     std::ostream::operator<<
                               ((ostream *)&std::cout,
                                (this->rIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[this->i]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,": L= ",5);
            poVar8 = std::ostream::_M_insert<double>
                               ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", Ax=",5);
            poVar8 = std::ostream::_M_insert<double>(dVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", U=",4);
            poVar8 = std::ostream::_M_insert<double>
                               ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", y=",4);
            poVar8 = std::ostream::_M_insert<double>
                               ((this->rowDual).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[this->i]);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          bVar7 = false;
        }
      }
      iVar9 = this->i + 1;
      this->i = iVar9;
    } while (iVar9 < this->numRow);
  }
  if (bVar7) {
    if (this->print == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Dual feasible.\n",0xf);
      return;
    }
  }
  else {
    if (this->print == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"KKT check error: Dual feasibility fail.\n",0x28);
    }
    this->istrueGlb = true;
  }
  return;
}

Assistant:

void KktCheck::chDualFeas() {
	bool istrue = true;
	
	//check values of z_j are dual feasible
	for (i=0; i<numCol;i++) {
		// j not in L or U
		if (colLower[i] == -HSOL_CONST_INF && colUpper[i] == HSOL_CONST_INF) {
			if (abs(colDual[i]) > tol) {
				if (print == 1) 
					cout<<"Dual feasibility fail: l=-inf, x["<<cIndexRev[i]<<"]="<<colValue[i]<<", u=inf, z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: l=-inf, x["<<i<<"]="<<colValue[i]<<", u=inf, z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
		// j in L: x=l and l<u
		else if (colValue[i] == colLower[i] && colLower[i] < colUpper[i]) {
			if (colDual[i]<0 && abs(colDual[i]) > tol) {
				if (print == 1)  
					cout<<"Dual feasibility fail: l["<<cIndexRev[i]<<"]="<<colLower[i]<<" = x["<<cIndexRev[i]<<"]="<<colValue[i]<<", z["<<cIndexRev[i]<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: l["<<i<<"]="<<colLower[i]<<" = x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
		// j in U: x=u and l<u
		else if (colValue[i] == colUpper[i] && colLower[i] < colUpper[i]) {
			if (colDual[i]>tol) {
				if (print == 1)  
					cout<<"Dual feasibility fail: x["<<cIndexRev[i]<<"]="<<colValue[i]<<"=u["<<cIndexRev[i]<<"], z["<<cIndexRev[i]<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: x["<<i<<"]="<<colValue[i]<<"=u["<<i<<"], z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
	}
	
	//check values of y_i are dual feasible
	for (i=0; i<numRow;i++) {
		double rowV = 0;
		for (k=ARstart[i]; k<ARstart[i+1]; k++)
			rowV = rowV + colValue[ARindex[k]]*ARvalue[k];

		// L = Ax = U can be any sign
		if (abs(rowLower[i] - rowV) < tol && abs(rowUpper[i] - rowV) < tol) {
		}
		// L = Ax < U
		else if (abs(rowLower[i] - rowV) < tol && rowV < rowUpper[i]) {

			if (rowDual[i] > tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
				istrue = false;
			}
		}
		// L < Ax = U
		else if (rowLower[i] < rowV && abs(rowV - rowUpper[i]) < tol) {
			//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
			if (rowDual[i] < -tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
				istrue = false;
			}
		}
		// L < Ax < U
		else if ((rowLower[i] < (rowV+tol)) && (rowV < (rowUpper[i]+tol))) {
			if (abs(rowDual[i]) > tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;istrue = false;
				istrue = false;
			}
		}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Dual feasible.\n";
	}
	else  {
		if (print == 1) 
			cout<<"KKT check error: Dual feasibility fail.\n";
		istrueGlb = true;
	}
	
}